

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O0

void __thiscall AsyncLog::ThreadFunc(AsyncLog *this)

{
  LockGuard LVar1;
  bool bVar2;
  FixedBuffer<4096UL> *pFVar3;
  type pMVar4;
  pointer pCVar5;
  pointer pFVar6;
  Mutex *pMVar7;
  pointer pLVar8;
  reference pvVar9;
  char *pcVar10;
  size_t sVar11;
  size_type sVar12;
  ulong local_70;
  size_t i_1;
  LockGuard lock;
  size_t i;
  LockGuard lock_2;
  LockGuard lock_1;
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  vecWriteBuffers;
  BufferPtr secondBuffer;
  unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> local_18;
  BufferPtr firstBuffer;
  AsyncLog *this_local;
  
  firstBuffer._M_t.
  super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
  super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
  super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>,_true,_true>)
       (__uniq_ptr_data<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>,_true,_true>)
       this;
  pFVar3 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  FixedBuffer<4096UL>::FixedBuffer(pFVar3);
  std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>::
  unique_ptr<std::default_delete<FixedBuffer<4096ul>>,void>
            ((unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>> *)&local_18,
             pFVar3);
  pFVar3 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  FixedBuffer<4096UL>::FixedBuffer(pFVar3);
  std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>::
  unique_ptr<std::default_delete<FixedBuffer<4096ul>>,void>
            ((unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>> *)
             &vecWriteBuffers.
              super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pFVar3);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::vector((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
            *)&lock_1);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::reserve((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             *)&lock_1,0x10);
  pMVar4 = std::unique_ptr<Mutex,_std::default_delete<Mutex>_>::operator*(&this->m_mutex);
  LockGuard::LockGuard(&lock_2,pMVar4);
  pCVar5 = std::unique_ptr<Condition,_std::default_delete<Condition>_>::operator->
                     (&this->m_mainThreadRunCond);
  Condition::Notify(pCVar5);
  LockGuard::~LockGuard(&lock_2);
  while ((this->m_bRunning & 1U) != 0) {
    pMVar4 = std::unique_ptr<Mutex,_std::default_delete<Mutex>_>::operator*(&this->m_mutex);
    LockGuard::LockGuard((LockGuard *)&i,pMVar4);
    bVar2 = std::
            vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
            ::empty(&this->m_buffers);
    if (bVar2) {
      pCVar5 = std::unique_ptr<Condition,_std::default_delete<Condition>_>::operator->
                         (&this->m_subThreadFlushCond);
      Condition::WaitForSeconds(pCVar5,3.0);
    }
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::push_back(&this->m_buffers,&this->m_curBuff);
    std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::operator=
              (&this->m_curBuff,&local_18);
    pFVar6 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
             operator->(&this->m_curBuff);
    FixedBuffer<4096UL>::Reset(pFVar6);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_nextBuff);
    if (!bVar2) {
      std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::operator=
                (&this->m_nextBuff,
                 (unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
                 &vecWriteBuffers.
                  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pFVar6 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
               operator->(&this->m_nextBuff);
      FixedBuffer<4096UL>::Reset(pFVar6);
    }
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::swap(&this->m_buffers,
           (vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
            *)&lock_1);
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::clear(&this->m_buffers);
    LockGuard::~LockGuard((LockGuard *)&i);
    for (lock.m_mutex = (Mutex *)0x0; LVar1.m_mutex = lock.m_mutex,
        pMVar7 = (Mutex *)std::
                          vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                          ::size((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                                  *)&lock_1), LVar1.m_mutex < pMVar7;
        lock.m_mutex = (Mutex *)((long)&(lock.m_mutex)->m_mutex + 1)) {
      pLVar8 = std::unique_ptr<LogFile,_std::default_delete<LogFile>_>::operator->
                         (&this->m_logFilePtr);
      pvVar9 = std::
               vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                             *)&lock_1,(size_type)lock.m_mutex);
      pFVar6 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
               operator->(pvVar9);
      pcVar10 = FixedBuffer<4096UL>::Data(pFVar6);
      pvVar9 = std::
               vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                             *)&lock_1,(size_type)lock.m_mutex);
      pFVar6 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
               operator->(pvVar9);
      sVar11 = FixedBuffer<4096UL>::Size(pFVar6);
      LogFile::Append(pLVar8,pcVar10,sVar11);
    }
    pvVar9 = std::
             vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                           *)&lock_1,0);
    std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::operator=
              (&local_18,pvVar9);
    sVar12 = std::
             vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ::size((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                     *)&lock_1);
    if (1 < sVar12) {
      pvVar9 = std::
               vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                             *)&lock_1,1);
      std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::operator=
                ((unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
                 &vecWriteBuffers.
                  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9);
    }
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::clear((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             *)&lock_1);
    pLVar8 = std::unique_ptr<LogFile,_std::default_delete<LogFile>_>::operator->
                       (&this->m_logFilePtr);
    LogFile::Flush(pLVar8);
  }
  pMVar4 = std::unique_ptr<Mutex,_std::default_delete<Mutex>_>::operator*(&this->m_mutex);
  LockGuard::LockGuard((LockGuard *)&i_1,pMVar4);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::push_back(&this->m_buffers,&this->m_curBuff);
  for (local_70 = 0;
      sVar12 = std::
               vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ::size(&this->m_buffers), local_70 < sVar12; local_70 = local_70 + 1) {
    pLVar8 = std::unique_ptr<LogFile,_std::default_delete<LogFile>_>::operator->
                       (&this->m_logFilePtr);
    pvVar9 = std::
             vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ::operator[](&this->m_buffers,local_70);
    pFVar6 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
             operator->(pvVar9);
    pcVar10 = FixedBuffer<4096UL>::Data(pFVar6);
    pvVar9 = std::
             vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ::operator[](&this->m_buffers,local_70);
    pFVar6 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
             operator->(pvVar9);
    sVar11 = FixedBuffer<4096UL>::Size(pFVar6);
    LogFile::Append(pLVar8,pcVar10,sVar11);
  }
  pLVar8 = std::unique_ptr<LogFile,_std::default_delete<LogFile>_>::operator->(&this->m_logFilePtr);
  LogFile::Flush(pLVar8);
  LockGuard::~LockGuard((LockGuard *)&i_1);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::~vector((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             *)&lock_1);
  std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::~unique_ptr
            ((unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
             &vecWriteBuffers.
              super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

void AsyncLog::ThreadFunc()
{
	BufferPtr firstBuffer(new Buffer);
	BufferPtr secondBuffer(new Buffer);
	std::vector<BufferPtr> vecWriteBuffers;
	vecWriteBuffers.reserve(16);
	{
		LockGuard lock(*m_mutex);
		m_mainThreadRunCond->Notify();
	}
	//std::cout << "Sub thread, " << __LINE__ << " Running " << std::endl;
	while(m_bRunning)
	{
		{
			LockGuard lock(*m_mutex);
			if (m_buffers.empty())
			{
				//std::cout << "Sub thread, wait for Condition, " << __LINE__ << std::endl;
				m_subThreadFlushCond->WaitForSeconds(3);
				//m_subThreadFlushCond.Wait();
			}
			//std::cout << "Sub thread, " << __LINE__ << " Buffer size, " <<m_buffers.size() << std::endl;
			
			m_buffers.push_back(std::move(m_curBuff));
			m_curBuff = std::move(firstBuffer);
			m_curBuff->Reset();
			if (!m_nextBuff)
			{
				m_nextBuff = std::move(secondBuffer);
				m_nextBuff->Reset();
			}
			
			m_buffers.swap(vecWriteBuffers);
			m_buffers.clear();
		}
		
		for (size_t i = 0; i < vecWriteBuffers.size(); ++i)
		{
			m_logFilePtr->Append(vecWriteBuffers[i]->Data(), vecWriteBuffers[i]->Size());
		}
		
		firstBuffer = std::move(vecWriteBuffers[0]);
		if (2 <= vecWriteBuffers.size())
		{
			secondBuffer = std::move(vecWriteBuffers[1]);
		}
		vecWriteBuffers.clear();
		m_logFilePtr->Flush();
	}

	// push data in buffer to the log file
	LockGuard lock(*m_mutex);
	m_buffers.push_back(std::move(m_curBuff));
	for (size_t i = 0; i < m_buffers.size(); ++i)
	{
		m_logFilePtr->Append(m_buffers[i]->Data(), m_buffers[i]->Size());
	}
	m_logFilePtr->Flush();
}